

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int breada(bstring b,bNread readPtr,void *parm)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  
  if (((b != (bstring)0x0) && (0 < b->mlen)) &&
     (uVar4 = b->slen, readPtr != (bNread)0x0 && uVar4 <= (uint)b->mlen)) {
    iVar2 = uVar4 + 0x10;
    while (iVar1 = balloc(b,iVar2 + 1), iVar1 == 0) {
      sVar3 = (*readPtr)(b->data + uVar4,1,(long)(int)(iVar2 - uVar4),parm);
      uVar4 = uVar4 + (int)sVar3;
      b->slen = uVar4;
      if ((int)uVar4 < iVar2) {
        b->data[(int)uVar4] = '\0';
        return 0;
      }
      iVar1 = 0x400;
      if (iVar2 < 0x400) {
        iVar1 = iVar2;
      }
      iVar2 = iVar1 + iVar2;
    }
  }
  return -1;
}

Assistant:

int breada (bstring b, bNread readPtr, void * parm) {
int i, l, n;

	if (b == NULL || b->mlen <= 0 || b->slen < 0 || b->mlen < b->slen ||
	    b->mlen <= 0 || readPtr == NULL) return BSTR_ERR;

	i = b->slen;
	for (n=i+16; ; n += ((n < BS_BUFF_SZ) ? n : BS_BUFF_SZ)) {
		if (BSTR_OK != balloc (b, n + 1)) return BSTR_ERR;
		l = (int) readPtr ((void *) (b->data + i), 1, n - i, parm);
		i += l;
		b->slen = i;
		if (i < n) break;
	}

	b->data[i] = (unsigned char) '\0';
	return 0;
}